

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_24_3_f49331b9 * __thiscall
qclab::qgates::lambda_PauliY<std::complex<float>>
          (anon_class_24_3_f49331b9 *__return_storage_ptr__,qgates *this,Op op,
          complex<float> *vector)

{
  undefined7 in_register_00000011;
  anon_class_24_3_f49331b9 f;
  complex<float> lambda2;
  complex<float> lambda1;
  complex<float> *vector_local;
  Op op_local;
  
  std::complex<float>::complex(&lambda2,0.0,-1.0);
  std::complex<float>::complex(&f.lambda2,0.0,1.0);
  if ((char)this == 'T') {
    std::swap<std::complex<float>>(&lambda2,&f.lambda2);
  }
  __return_storage_ptr__->vector = (complex<float> *)CONCAT71(in_register_00000011,op);
  (__return_storage_ptr__->lambda1)._M_value = lambda2._M_value;
  (__return_storage_ptr__->lambda2)._M_value = f.lambda2._M_value;
  return __return_storage_ptr__;
}

Assistant:

auto lambda_PauliY( Op op , T* vector ) {
    // operation
    T lambda1 = T( 0 , -1 ) ;
    T lambda2 = T( 0 ,  1 ) ;
    if ( op == Op::Trans ) std::swap( lambda1 , lambda2 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      std::swap( vector[a] , vector[b] ) ;
      vector[a] *= lambda1 ;
      vector[b] *= lambda2 ;
    } ;
    return f ;
  }